

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall Lexer::readToken(Token *__return_storage_ptr__,Lexer *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte __rhs;
  int iVar3;
  long *plVar4;
  undefined8 extraout_RAX;
  uint uVar5;
  size_type *psVar6;
  Token token;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  skipWhitespace(this);
  __return_storage_ptr__->type = NullToken;
  __return_storage_ptr__->lineNumber = 0;
  __return_storage_ptr__->columnNumber = 0;
  this_00 = &__return_storage_ptr__->tokenData;
  paVar1 = &(__return_storage_ptr__->tokenData).field_2;
  (__return_storage_ptr__->tokenData)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->tokenData)._M_string_length = 0;
  (__return_storage_ptr__->tokenData).field_2._M_local_buf[0] = '\0';
  local_68._0_4_ = this->_currentLineNo;
  local_68._4_4_ = this->_currentColumnNo;
  uStack_60 = 0;
  __rhs = readChar(this);
  this->_currentColumnNo = this->_currentColumnNo + -1;
  iVar3 = isalpha((int)(char)__rhs);
  if (((iVar3 == 0) && (__rhs != 0x5f)) && (__rhs != 0x2e)) {
    if (__rhs == 0x2d || (int)(char)__rhs - 0x30U < 10) {
      readNumber((Token *)local_d8,this);
      goto LAB_00107e1e;
    }
    uVar5 = __rhs - 0x23;
    if (uVar5 < 0x1e) {
      if ((0x800261U >> (uVar5 & 0x1f) & 1) == 0) {
        if (uVar5 != 0x1d) goto LAB_00107eef;
        readRegister((Token *)local_d8,this);
      }
      else {
        readDelimiter((Token *)local_d8,this);
      }
      goto LAB_00107e1e;
    }
LAB_00107eef:
    if (__rhs != 0) {
      local_48 = 0;
      local_40[0] = 0;
      local_50 = local_40;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_a8._M_dataplus._M_p = (pointer)*plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_a8._M_dataplus._M_p == psVar6) {
        local_a8.field_2._M_allocated_capacity = *psVar6;
        local_a8.field_2._8_8_ = plVar4[3];
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar6;
      }
      local_a8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     &local_a8,__rhs);
      plVar4 = (long *)std::__cxx11::string::append(local_d8);
      local_88._M_dataplus._M_p = (pointer)*plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar6) {
        local_88.field_2._M_allocated_capacity = *psVar6;
        local_88.field_2._8_8_ = plVar4[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar6;
      }
      local_88._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      lexerError(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      pcVar2 = (this_00->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2);
      }
      _Unwind_Resume(extraout_RAX);
    }
    local_d8._0_8_ = (pointer)0x6;
    local_d8._8_4_ = 0;
    local_c8._8_8_ = 0;
    local_b8._M_local_buf[0] = '\0';
    __return_storage_ptr__->columnNumber = 0;
    __return_storage_ptr__->type = LineTerminatorToken;
    __return_storage_ptr__->lineNumber = 0;
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    std::__cxx11::string::operator=((string *)this_00,(string *)(local_d8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity == &local_b8) goto LAB_00107e52;
  }
  else {
    readKeywordOrIdentifier((Token *)local_d8,this);
LAB_00107e1e:
    __return_storage_ptr__->columnNumber = local_d8._8_4_;
    __return_storage_ptr__->type = local_d8._0_4_;
    __return_storage_ptr__->lineNumber = local_d8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)(local_d8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity == &local_b8) goto LAB_00107e52;
  }
  operator_delete((void *)local_c8._M_allocated_capacity);
LAB_00107e52:
  __return_storage_ptr__->lineNumber = (int)local_68 + 1;
  __return_storage_ptr__->columnNumber = local_68._4_4_ + 1;
  skipWhitespace(this);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::readToken() {
    skipWhitespace();

    Token token{Token::NullToken};

    int lineNo = _currentLineNo + 1;
    int colNo = _currentColumnNo + 1;

    char c = peekChar();

    if(std::isalpha(c) || c == '.' || c == '_') {
        token = readKeywordOrIdentifier();
    } else if(std::isdigit(c) || c == '-') {
        token = readNumber();
    } else {
        switch(c) {
//            case '.':
//                token = readKeyword();
//                break;
            case '@':
                token = readRegister();
                break;
            case '\0':
                token = readLineTerminator();
                break;
            case ',':
            case '(':
            case ')':
            case ':':
            case '#':
                token = readDelimiter();
                break;
            default:
                lexerError(std::string{} + "unexpected character: '" + c + "'");
        }
    }

    token.lineNumber = lineNo;
    token.columnNumber = colNo;

    skipWhitespace();

    return token;
}